

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O0

errno_t memset_s(void *dest,rsize_t len,uint8_t value)

{
  long lVar1;
  undefined1 in_DL;
  void *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint8_t unaff_retaddr;
  undefined3 unaff_retaddr_00;
  uint32_t len_00;
  undefined3 in_stack_ffffffffffffffdc;
  errno_t error;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  error = CONCAT13(in_DL,in_stack_ffffffffffffffdc);
  if (in_RDI == (char *)0x0) {
    invoke_safe_mem_constraint_handler((char *)0x0,in_RSI,error);
    local_c = 400;
  }
  else if (in_RSI == (void *)0x0) {
    invoke_safe_mem_constraint_handler(in_RDI,(void *)0x0,error);
    local_c = 0x191;
  }
  else if (in_RSI < (void *)0x10000001) {
    mem_prim_set((void *)len,len_00,unaff_retaddr);
    local_c = 0;
  }
  else {
    invoke_safe_mem_constraint_handler(in_RDI,in_RSI,error);
    local_c = 0x193;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memset_s (void *dest, rsize_t len, uint8_t value)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memset_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (len == 0) {
        invoke_safe_mem_constraint_handler("memset_s: len is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (len > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memset_s: len exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    mem_prim_set(dest, len, value);

    return (RCNEGATE(EOK));
}